

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tearing.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLint GVar6;
  GLFWmonitor *handle;
  GLFWvidmode *pGVar7;
  GLFWwindow *handle_00;
  undefined1 *puVar8;
  vec4 *pafVar9;
  int i;
  long lVar10;
  vec4 *pafVar11;
  int i_1;
  long lVar12;
  undefined8 *puVar13;
  long lVar14;
  long lVar15;
  int height_00;
  float fVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  int height;
  int width;
  double local_148;
  GLuint vertex_buffer;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [48];
  float local_c8;
  undefined8 local_c4;
  mat4x4 temp;
  mat4x4 mvp;
  
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
LAB_00113bf3:
    exit(1);
  }
  handle = (GLFWmonitor *)0x0;
  while( true ) {
    iVar2 = getopt(argc,argv,"hf");
    if (iVar2 != 0x66) break;
    handle = glfwGetPrimaryMonitor();
  }
  if (iVar2 == -1) {
    if (handle == (GLFWmonitor *)0x0) {
      iVar2 = 0x280;
      height_00 = 0x1e0;
    }
    else {
      pGVar7 = glfwGetVideoMode(handle);
      glfwWindowHint(0x2100f,pGVar7->refreshRate);
      glfwWindowHint(0x21001,pGVar7->redBits);
      glfwWindowHint(0x21002,pGVar7->greenBits);
      glfwWindowHint(0x21003,pGVar7->blueBits);
      iVar2 = pGVar7->width;
      height_00 = pGVar7->height;
    }
    glfwWindowHint(0x22002,2);
    glfwWindowHint(0x22003,0);
    handle_00 = glfwCreateWindow(iVar2,height_00,"Tearing detector",handle,(GLFWwindow *)0x0);
    if (handle_00 == (GLFWwindow *)0x0) {
      glfwTerminate();
      goto LAB_00113bf3;
    }
    glfwMakeContextCurrent(handle_00);
    gladLoadGLLoader(glfwGetProcAddress);
    set_swap_interval(handle_00,0);
    local_148 = glfwGetTime();
    frame_rate = 0.0;
    iVar2 = glfwExtensionSupported("WGL_EXT_swap_control_tear");
    if (iVar2 == 0) {
      iVar2 = glfwExtensionSupported("GLX_EXT_swap_control_tear");
      swap_tear = (int)(iVar2 != 0);
    }
    else {
      swap_tear = 1;
    }
    glfwSetKeyCallback(handle_00,key_callback);
    (*glad_glGenBuffers)(1,&vertex_buffer);
    (*glad_glBindBuffer)(0x8892,vertex_buffer);
    (*glad_glBufferData)(0x8892,0x20,vertices,0x88e4);
    GVar3 = (*glad_glCreateShader)(0x8b31);
    lVar15 = 0;
    (*glad_glShaderSource)(GVar3,1,&vertex_shader_text,(GLint *)0x0);
    (*glad_glCompileShader)(GVar3);
    GVar4 = (*glad_glCreateShader)(0x8b30);
    (*glad_glShaderSource)(GVar4,1,&fragment_shader_text,(GLint *)0x0);
    (*glad_glCompileShader)(GVar4);
    GVar5 = (*glad_glCreateProgram)();
    (*glad_glAttachShader)(GVar5,GVar3);
    (*glad_glAttachShader)(GVar5,GVar4);
    (*glad_glLinkProgram)(GVar5);
    GVar6 = (*glad_glGetUniformLocation)(GVar5,"MVP");
    GVar3 = (*glad_glGetAttribLocation)(GVar5,"vPos");
    (*glad_glEnableVertexAttribArray)(GVar3);
    (*glad_glVertexAttribPointer)(GVar3,2,0x1406,'\0',8,(void *)0x0);
    while( true ) {
      iVar2 = glfwWindowShouldClose(handle_00);
      if (iVar2 != 0) break;
      dVar1 = glfwGetTime();
      fVar16 = cosf((float)dVar1 * 4.0);
      glfwGetFramebufferSize(handle_00,&width,&height);
      (*glad_glViewport)(0,0,width,height);
      (*glad_glClear)(0x4000);
      local_138 = 0x3f800000;
      uStack_130 = 0;
      local_128 = 0x3f80000000000000;
      uStack_120 = 0;
      local_118 = 0;
      uStack_110 = 0xc0000000;
      local_108 = 0x8000000080000000;
      uStack_100 = 0x3f800000bf800000;
      puVar8 = local_f8;
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
          uVar17 = 0x3f800000;
          if (lVar10 != lVar12) {
            uVar17 = 0;
          }
          *(undefined4 *)(puVar8 + lVar12 * 4) = uVar17;
        }
        puVar8 = puVar8 + 0x10;
      }
      local_c8 = fVar16 * 0.75;
      local_c4 = 0;
      puVar8 = local_f8;
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        puVar13 = &local_138;
        for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
          fVar16 = 0.0;
          for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
            fVar16 = fVar16 + *(float *)((long)puVar13 + lVar14 * 4) * *(float *)(puVar8 + lVar14);
          }
          temp[lVar10][lVar12] = fVar16;
          puVar13 = (undefined8 *)((long)puVar13 + 4);
        }
        puVar8 = puVar8 + 0x10;
      }
      pafVar9 = temp;
      pafVar11 = mvp;
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
          (*pafVar11)[lVar12] = (*pafVar9)[lVar12];
        }
        pafVar11 = pafVar11 + 1;
        pafVar9 = pafVar9 + 1;
      }
      (*glad_glUseProgram)(GVar5);
      (*glad_glUniformMatrix4fv)(GVar6,1,'\0',mvp[0]);
      (*glad_glDrawArrays)(6,0,4);
      glfwSwapBuffers(handle_00);
      glfwPollEvents();
      lVar15 = lVar15 + 1;
      dVar1 = glfwGetTime();
      if (1.0 < dVar1 - local_148) {
        auVar18._8_4_ = (int)((ulong)lVar15 >> 0x20);
        auVar18._0_8_ = lVar15;
        auVar18._12_4_ = 0x45300000;
        frame_rate = ((auVar18._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) /
                     (dVar1 - local_148);
        update_window_title(handle_00);
        lVar15 = 0;
        local_148 = dVar1;
      }
    }
    glfwTerminate();
  }
  else {
    if (iVar2 != 0x68) {
      usage();
      goto LAB_00113bf3;
    }
    usage();
  }
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    unsigned long frame_count = 0;
    GLFWmonitor* monitor = NULL;
    int ch, width, height;
    double last_time, current_time;
    GLFWwindow* window;
    GLuint vertex_buffer, vertex_shader, fragment_shader, program;
    GLint mvp_location, vpos_location;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    while ((ch = getopt(argc, argv, "hf")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                monitor = glfwGetPrimaryMonitor();
                break;

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    if (monitor)
    {
        const GLFWvidmode* mode = glfwGetVideoMode(monitor);

        glfwWindowHint(GLFW_REFRESH_RATE, mode->refreshRate);
        glfwWindowHint(GLFW_RED_BITS, mode->redBits);
        glfwWindowHint(GLFW_GREEN_BITS, mode->greenBits);
        glfwWindowHint(GLFW_BLUE_BITS, mode->blueBits);

        width = mode->width;
        height = mode->height;
    }
    else
    {
        width  = 640;
        height = 480;
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    window = glfwCreateWindow(width, height, "Tearing detector", monitor, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    set_swap_interval(window, 0);

    last_time = glfwGetTime();
    frame_rate = 0.0;
    swap_tear = (glfwExtensionSupported("WGL_EXT_swap_control_tear") ||
                 glfwExtensionSupported("GLX_EXT_swap_control_tear"));

    glfwSetKeyCallback(window, key_callback);

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    mvp_location = glGetUniformLocation(program, "MVP");
    vpos_location = glGetAttribLocation(program, "vPos");

    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) 0);

    while (!glfwWindowShouldClose(window))
    {
        int width, height;
        mat4x4 m, p, mvp;
        float position = cosf((float) glfwGetTime() * 4.f) * 0.75f;

        glfwGetFramebufferSize(window, &width, &height);

        glViewport(0, 0, width, height);
        glClear(GL_COLOR_BUFFER_BIT);

        mat4x4_ortho(p, -1.f, 1.f, -1.f, 1.f, 0.f, 1.f);
        mat4x4_translate(m, position, 0.f, 0.f);
        mat4x4_mul(mvp, p, m);

        glUseProgram(program);
        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
        glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

        glfwSwapBuffers(window);
        glfwPollEvents();

        frame_count++;

        current_time = glfwGetTime();
        if (current_time - last_time > 1.0)
        {
            frame_rate = frame_count / (current_time - last_time);
            frame_count = 0;
            last_time = current_time;
            update_window_title(window);
        }
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}